

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.cpp
# Opt level: O2

XMLContentModel * __thiscall
xercesc_4_0::ComplexTypeInfo::makeContentModel(ComplexTypeInfo *this,bool checkUPA)

{
  NodeTypes cmOp;
  NodeTypes NVar1;
  bool bAllowCompactSyntax;
  int iVar2;
  ContentSpecNode *pCVar3;
  undefined4 extraout_var;
  DFAContentModel *this_00;
  RuntimeException *pRVar4;
  
  pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
  ContentSpecNode::ContentSpecNode(pCVar3,this->fContentSpec);
  if (checkUPA) {
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(ulong)this->fContentSpecOrgURISize << 2);
    this->fContentSpecOrgURI = (uint *)CONCAT44(extraout_var,iVar2);
  }
  bAllowCompactSyntax = useRepeatingLeafNodes(this,pCVar3);
  pCVar3 = convertContentSpecTree(this,pCVar3,checkUPA,bAllowCompactSyntax);
  iVar2 = this->fContentType;
  if (1 < iVar2 - 3U) {
    if (iVar2 - 5U < 2) {
      this_00 = (DFAContentModel *)0x0;
    }
    else {
      if (iVar2 != 2) {
        pRVar4 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (pRVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/ComplexTypeInfo.cpp"
                   ,0x1df,CM_MustBeMixedOrChildren,this->fMemoryManager);
        __cxa_throw(pRVar4,&RuntimeException::typeinfo,XMLException::~XMLException);
      }
      this_00 = (DFAContentModel *)XMemory::operator_new(0x30,this->fMemoryManager);
      MixedContentModel::MixedContentModel
                ((MixedContentModel *)this_00,false,pCVar3,false,this->fMemoryManager);
    }
    if (pCVar3 == (ContentSpecNode *)0x0) {
      return &this_00->super_XMLContentModel;
    }
    goto LAB_002fcd1c;
  }
  if (pCVar3 == (ContentSpecNode *)0x0) {
    pRVar4 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (pRVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/ComplexTypeInfo.cpp"
               ,0x174,CM_UnknownCMSpecType,this->fMemoryManager);
    __cxa_throw(pRVar4,&RuntimeException::typeinfo,XMLException::~XMLException);
  }
  cmOp = pCVar3->fType;
  if ((pCVar3->fElement != (QName *)0x0) && (pCVar3->fElement->fURIId == 0xffffffff)) {
    pRVar4 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (pRVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/ComplexTypeInfo.cpp"
               ,0x17c,CM_NoPCDATAHere,this->fMemoryManager);
LAB_002fcf8a:
    __cxa_throw(pRVar4,&RuntimeException::typeinfo,XMLException::~XMLException);
  }
  if (((cmOp & (Any_NS|Any)) == Any) || (cmOp == Loop || (cmOp & (Any_NS|Any_Other)) == Any_NS))
  goto LAB_002fccae;
  if (iVar2 == 3) {
    if (cmOp == ZeroOrOne) {
      if (pCVar3->fFirst->fType == All) {
        this_00 = (DFAContentModel *)XMemory::operator_new(0x30,this->fMemoryManager);
        AllContentModel::AllContentModel
                  ((AllContentModel *)this_00,pCVar3->fFirst,true,this->fMemoryManager);
        goto LAB_002fcf14;
      }
    }
    else if (cmOp == All) {
      this_00 = (DFAContentModel *)XMemory::operator_new(0x30,this->fMemoryManager);
      AllContentModel::AllContentModel((AllContentModel *)this_00,pCVar3,true,this->fMemoryManager);
      goto LAB_002fcf14;
    }
  }
  else {
    if (cmOp == Leaf) {
      this_00 = (DFAContentModel *)XMemory::operator_new(0x28,this->fMemoryManager);
      SimpleContentModel::SimpleContentModel
                ((SimpleContentModel *)this_00,false,pCVar3->fElement,(QName *)0x0,Leaf,
                 this->fMemoryManager);
    }
    else if ((cmOp & (Any_NS|Any)) == Choice) {
      if (((pCVar3->fFirst->fType != Leaf) || (pCVar3->fSecond == (ContentSpecNode *)0x0)) ||
         (pCVar3->fSecond->fType != Leaf)) goto LAB_002fccae;
      this_00 = (DFAContentModel *)XMemory::operator_new(0x28,this->fMemoryManager);
      SimpleContentModel::SimpleContentModel
                ((SimpleContentModel *)this_00,false,pCVar3->fFirst->fElement,
                 pCVar3->fSecond->fElement,cmOp,this->fMemoryManager);
    }
    else if ((uint)(cmOp + UnknownType) < 3) {
      NVar1 = pCVar3->fFirst->fType;
      if (NVar1 == All) {
        this_00 = (DFAContentModel *)XMemory::operator_new(0x30,this->fMemoryManager);
        AllContentModel::AllContentModel
                  ((AllContentModel *)this_00,pCVar3->fFirst,false,this->fMemoryManager);
      }
      else {
        if (NVar1 != Leaf) goto LAB_002fccae;
        this_00 = (DFAContentModel *)XMemory::operator_new(0x28,this->fMemoryManager);
        SimpleContentModel::SimpleContentModel
                  ((SimpleContentModel *)this_00,false,pCVar3->fFirst->fElement,(QName *)0x0,cmOp,
                   this->fMemoryManager);
      }
    }
    else {
      if (cmOp != All) {
        pRVar4 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (pRVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/ComplexTypeInfo.cpp"
                   ,0x1d6,CM_UnknownCMSpecType,this->fMemoryManager);
        goto LAB_002fcf8a;
      }
      this_00 = (DFAContentModel *)XMemory::operator_new(0x30,this->fMemoryManager);
      AllContentModel::AllContentModel((AllContentModel *)this_00,pCVar3,false,this->fMemoryManager)
      ;
    }
LAB_002fcf14:
    if (this_00 != (DFAContentModel *)0x0) goto LAB_002fcd1c;
  }
LAB_002fccae:
  this_00 = (DFAContentModel *)XMemory::operator_new(0x88,this->fMemoryManager);
  DFAContentModel::DFAContentModel(this_00,false,pCVar3,iVar2 == 3,this->fMemoryManager);
LAB_002fcd1c:
  (*(pCVar3->super_XSerializable)._vptr_XSerializable[1])(pCVar3);
  return &this_00->super_XMLContentModel;
}

Assistant:

XMLContentModel* ComplexTypeInfo::makeContentModel(bool checkUPA)
{
    ContentSpecNode* aSpecNode = new (fMemoryManager) ContentSpecNode(*fContentSpec);

    if (checkUPA) {
        try
        {
            fContentSpecOrgURI = (unsigned int*) fMemoryManager->allocate
            (
                fContentSpecOrgURISize * sizeof(unsigned int)
            ); //new unsigned int[fContentSpecOrgURISize];
        }
        catch (const OutOfMemoryException&)
        {
            delete aSpecNode;

            throw;
        }
    }

    aSpecNode = convertContentSpecTree(aSpecNode, checkUPA, useRepeatingLeafNodes(aSpecNode));

    Janitor<ContentSpecNode> janSpecNode(aSpecNode);

    XMLContentModel* cmRet = 0;
    if (fContentType == SchemaElementDecl::Simple ||
        fContentType == SchemaElementDecl::ElementOnlyEmpty) {
       // just return nothing
    }
    else if (fContentType == SchemaElementDecl::Mixed_Simple)
    {
        //
        //  Just create a mixel content model object. This type of
        //  content model is optimized for mixed content validation.
        //
        cmRet = new (fMemoryManager) MixedContentModel(false, aSpecNode, false, fMemoryManager);
    }
    else if (fContentType == SchemaElementDecl::Mixed_Complex ||
             fContentType == SchemaElementDecl::Children)
    {
        bool isMixed = (fContentType == SchemaElementDecl::Mixed_Complex);

        //
        //  This method will create an optimal model for the complexity
        //  of the element's defined model. If its simple, it will create
        //  a SimpleContentModel object. If its a simple list, it will
        //  create a SimpleListContentModel object. If its complex, it
        //  will create a DFAContentModel object.
        //
        if(!aSpecNode)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);

        ContentSpecNode::NodeTypes specType = aSpecNode->getType();
        //
        //  Do a sanity check that the node is does not have a PCDATA id. Since,
        //  if it was, it should have already gotten taken by the Mixed model.
        //
        if (aSpecNode->getElement() && aSpecNode->getElement()->getURI() == XMLElementDecl::fgPCDataElemId)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_NoPCDATAHere, fMemoryManager);

        //
        //  According to the type of node, we will create the correct type of
        //  content model.
        //
        if (((specType & 0x0f) == ContentSpecNode::Any) ||
           ((specType & 0x0f) == ContentSpecNode::Any_Other) ||
           ((specType & 0x0f) == ContentSpecNode::Any_NS) ||
           specType == ContentSpecNode::Loop) {
           // let fall through to build a DFAContentModel
        }
        else if (isMixed)
        {
            if (specType == ContentSpecNode::All) {
                // All the nodes under an ALL must be additional ALL nodes and
                // ELEMENTs (or ELEMENTs under ZERO_OR_ONE nodes.)
                // We collapse the ELEMENTs into a single vector.
                cmRet = new (fMemoryManager) AllContentModel(aSpecNode, true, fMemoryManager);
            }
            else if (specType == ContentSpecNode::ZeroOrOne) {
                // An ALL node can appear under a ZERO_OR_ONE node.
                if (aSpecNode->getFirst()->getType() == ContentSpecNode::All) {
                    cmRet = new (fMemoryManager) AllContentModel(aSpecNode->getFirst(), true, fMemoryManager);
                }
            }

            // otherwise, let fall through to build a DFAContentModel
        }
         else if (specType == ContentSpecNode::Leaf)
        {
            // Create a simple content model
            cmRet = new (fMemoryManager) SimpleContentModel
            (
                false
                , aSpecNode->getElement()
                , 0
                , ContentSpecNode::Leaf
                , fMemoryManager
            );
        }
         else if (((specType & 0x0f) == ContentSpecNode::Choice)
              ||  ((specType & 0x0f) == ContentSpecNode::Sequence))
        {
            //
            //  Lets see if both of the children are leafs. If so, then it has to
            //  be a simple content model
            //
            if ((aSpecNode->getFirst()->getType() == ContentSpecNode::Leaf)
            &&  (aSpecNode->getSecond())
            &&  (aSpecNode->getSecond()->getType() == ContentSpecNode::Leaf))
            {
                cmRet = new (fMemoryManager) SimpleContentModel
                (
                    false
                    , aSpecNode->getFirst()->getElement()
                    , aSpecNode->getSecond()->getElement()
                    , specType
                    , fMemoryManager
                );
            }
        }
         else if ((specType == ContentSpecNode::OneOrMore)
              ||  (specType == ContentSpecNode::ZeroOrMore)
              ||  (specType == ContentSpecNode::ZeroOrOne))
        {
            //
            //  Its a repetition, so see if its one child is a leaf. If so its a
            //  repetition of a single element, so we can do a simple content
            //  model for that.
            //
            if (aSpecNode->getFirst()->getType() == ContentSpecNode::Leaf)
            {
                cmRet = new (fMemoryManager) SimpleContentModel
                (
                    false
                    , aSpecNode->getFirst()->getElement()
                    , 0
                    , specType
                    , fMemoryManager
                );
            }
            else if (aSpecNode->getFirst()->getType() == ContentSpecNode::All)
                cmRet = new (fMemoryManager) AllContentModel(aSpecNode->getFirst(), false, fMemoryManager);

        }
        else if (specType == ContentSpecNode::All)
            cmRet = new (fMemoryManager) AllContentModel(aSpecNode, false, fMemoryManager);
        else
        {
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);
        }

        // Its not any simple type of content, so create a DFA based content model
        if(cmRet==0)
            cmRet = new (fMemoryManager) DFAContentModel(false, aSpecNode, isMixed, fMemoryManager);
    }
     else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_MustBeMixedOrChildren, fMemoryManager);
    }

    return cmRet;
}